

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Node * prvTidyInferredTag(TidyDocImpl *doc,TidyTagId id)

{
  Lexer *pLVar1;
  uint uVar2;
  Node *pNVar3;
  Dict *pDVar4;
  tmbstr ptVar5;
  
  pLVar1 = doc->lexer;
  pNVar3 = (Node *)(*pLVar1->allocator->vtbl->alloc)(pLVar1->allocator,0x68);
  pNVar3->parent = (Node *)0x0;
  pNVar3->prev = (Node *)0x0;
  pNVar3->next = (Node *)0x0;
  pNVar3->content = (Node *)0x0;
  pNVar3->last = (Node *)0x0;
  pNVar3->attributes = (AttVal *)0x0;
  pNVar3->was = (Dict *)0x0;
  pNVar3->tag = (Dict *)0x0;
  pNVar3->element = (tmbstr)0x0;
  pNVar3->start = 0;
  pNVar3->end = 0;
  pNVar3->type = RootNode;
  pNVar3->line = 0;
  pNVar3->column = 0;
  pNVar3->closed = no;
  pNVar3->implicit = no;
  pNVar3->linebreak = no;
  uVar2 = pLVar1->columns;
  pNVar3->line = pLVar1->lines;
  pNVar3->column = uVar2;
  pNVar3->type = TextNode;
  pDVar4 = prvTidyLookupTagDef(id);
  if (pDVar4 != (Dict *)0x0) {
    pNVar3->type = StartTag;
    pNVar3->implicit = yes;
    ptVar5 = prvTidytmbstrdup(doc->allocator,pDVar4->name);
    pNVar3->element = ptVar5;
    pNVar3->tag = pDVar4;
    uVar2 = pLVar1->txtend;
    pNVar3->start = pLVar1->txtstart;
    pNVar3->end = uVar2;
    return pNVar3;
  }
  __assert_fail("dict != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/lexer.c"
                ,0x890,"Node *prvTidyInferredTag(TidyDocImpl *, TidyTagId)");
}

Assistant:

Node* TY_(InferredTag)(TidyDocImpl* doc, TidyTagId id)
{
    Lexer *lexer = doc->lexer;
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    const Dict* dict = TY_(LookupTagDef)(id);

    assert( dict != NULL );

    node->type = StartTag;
    node->implicit = yes;
    node->element = TY_(tmbstrdup)(doc->allocator, dict->name);
    node->tag = dict;
    node->start = lexer->txtstart;
    node->end = lexer->txtend;

    return node;
}